

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::VariablePortHeaderSyntax::setChild
          (VariablePortHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  DataTypeSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  DataTypeSyntax *local_58;
  DataTypeSyntax *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  VariablePortHeaderSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->constKeyword).kind = (undefined2)local_28;
    (this->constKeyword).field_0x2 = local_28._2_1_;
    (this->constKeyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->constKeyword).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->constKeyword).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->direction).kind = (undefined2)local_38;
    (this->direction).field_0x2 = local_38._2_1_;
    (this->direction).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->direction).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->direction).info = local_30;
    break;
  case 2:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->varKeyword).kind = (undefined2)local_48;
    (this->varKeyword).field_0x2 = local_48._2_1_;
    (this->varKeyword).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->varKeyword).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->varKeyword).info = local_40;
    break;
  case 3:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_158 = (DataTypeSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar1);
    }
    local_58 = local_158;
    not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
              ((not_null<slang::syntax::DataTypeSyntax*> *)&local_50,&local_58);
    (this->dataType).ptr = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0x35be);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void VariablePortHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: constKeyword = child.token(); return;
        case 1: direction = child.token(); return;
        case 2: varKeyword = child.token(); return;
        case 3: dataType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}